

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-write-queue-order.c
# Opt level: O2

void write_cb(uv_write_t *req,int status)

{
  FILE *__stream;
  undefined8 uVar1;
  char *pcVar2;
  undefined8 uStack_20;
  
  __stream = _stderr;
  if (req == (uv_write_t *)0x0) {
    pcVar2 = "req != NULL";
    uStack_20 = 0x65;
  }
  else {
    if (status == 0) {
      bytes_sent_done = bytes_sent_done + 0x2728000;
      write_cb_called = write_cb_called + 1;
      return;
    }
    uVar1 = uv_strerror(status);
    fprintf(__stream,"uv_write error: %s\n",uVar1);
    pcVar2 = "0";
    uStack_20 = 0x69;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
          ,uStack_20,pcVar2);
  abort();
}

Assistant:

static void write_cb(uv_write_t* req, int status) {
  if (status == 0)
    write_callbacks++;
  else if (status == UV_ECANCELED)
    write_cancelled_callbacks++;
  else
    write_error_callbacks++;
}